

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3157:41)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3157:41)>
          *this,string *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  int iVar3;
  long *plVar4;
  ulong *puVar5;
  When WVar6;
  string keypressLc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  ulong *local_e0;
  ulong local_d0;
  long lStack_c8;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined **local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_assign((string *)&local_a0);
  WVar6 = Never;
  local_58 = 0;
  local_60 = &PTR__BasicResult_001b2540;
  local_48 = 0;
  local_40 = 0;
  local_50 = &local_40;
  toLower(&local_c0,&local_a0);
  iVar3 = std::__cxx11::string::compare((char *)&local_c0);
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)&local_c0);
    if (iVar3 == 0) {
      WVar6 = BeforeStart;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_c0);
      if (iVar3 == 0) {
        WVar6 = BeforeExit;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_c0);
        if (iVar3 != 0) {
          std::operator+(&local_80,
                         "keypress argument must be one of: never, start, exit or both. \'",
                         &local_a0);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
          puVar5 = (ulong *)(plVar4 + 2);
          if ((ulong *)*plVar4 == puVar5) {
            local_d0 = *puVar5;
            lStack_c8 = plVar4[3];
            local_e0 = &local_d0;
          }
          else {
            local_d0 = *puVar5;
            local_e0 = (ulong *)*plVar4;
          }
          sVar2 = plVar4[1];
          *plVar4 = (long)puVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
          super_ResultBase.m_type = RuntimeError;
          (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
          super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2540;
          paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
          (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
          if (local_e0 == &local_d0) {
            paVar1->_M_allocated_capacity = local_d0;
            *(long *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = lStack_c8;
          }
          else {
            (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)local_e0;
            (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity = local_d0;
          }
          (__return_storage_ptr__->m_errorMessage)._M_string_length = sVar2;
          local_d0 = local_d0 & 0xffffffffffffff00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0016252e;
        }
        WVar6 = BeforeStartAndExit;
      }
    }
  }
  ((this->m_lambda).config)->waitForKeypress = WVar6;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2540;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_0016252e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_60 = &PTR__BasicResult_001b2540;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }